

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_unmap_mesh.cpp
# Opt level: O0

void Omega_h::unmap_parents
               (Mesh *old_mesh,Mesh *new_mesh,LOs *new_ents2old_ents_a,
               Few<Omega_h::Read<int>,_4> *old_ents2new_ents)

{
  int iVar1;
  Int IVar2;
  LO LVar3;
  Write<signed_char> local_1f8;
  Read<signed_char> local_1e8;
  Write<int> local_1d8;
  Read<int> local_1c8;
  Parents local_1b8;
  undefined1 local_198 [8];
  type functor;
  Parents old_parents;
  string local_e0 [32];
  undefined1 local_c0 [8];
  Write<signed_char> new_parent_code;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  Write<int> new_parent_idx;
  undefined1 auStack_60 [4];
  LO nnew_ents;
  LOs new_ents2old_ents;
  Int ent_dim;
  Few<Omega_h::Read<int>,_4> *old_ents2new_ents_local;
  LOs *new_ents2old_ents_a_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  ulong local_10;
  
  new_ents2old_ents.write_.shared_alloc_.direct_ptr._4_4_ = 1;
  while( true ) {
    iVar1 = new_ents2old_ents.write_.shared_alloc_.direct_ptr._4_4_;
    IVar2 = Mesh::dim(new_mesh);
    if (IVar2 < iVar1) break;
    Read<int>::Read((Read<int> *)auStack_60,
                    new_ents2old_ents_a + new_ents2old_ents.write_.shared_alloc_.direct_ptr._4_4_);
    if (((ulong)_auStack_60 & 1) == 0) {
      local_10 = _auStack_60->size;
    }
    else {
      local_10 = (ulong)_auStack_60 >> 3;
    }
    LVar3 = (LO)(local_10 >> 2);
    new_parent_idx.shared_alloc_.direct_ptr._4_4_ = LVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"parent idx",&local_99);
    Write<int>::Write((Write<int> *)local_78,LVar3,-1,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    LVar3 = new_parent_idx.shared_alloc_.direct_ptr._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,"parent code",
               (allocator *)((long)&old_parents.codes.write_.shared_alloc_.direct_ptr + 7));
    Write<signed_char>::Write((Write<signed_char> *)local_c0,LVar3,'\0',(string *)local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&old_parents.codes.write_.shared_alloc_.direct_ptr + 7));
    Mesh::ask_parents((Parents *)&functor.new_parent_code.shared_alloc_.direct_ptr,old_mesh,
                      new_ents2old_ents.write_.shared_alloc_.direct_ptr._4_4_);
    Read<int>::Read((Read<int> *)local_198,(Read<int> *)auStack_60);
    Parents::Parents((Parents *)&functor.new_ents2old_ents.write_.shared_alloc_.direct_ptr,
                     (Parents *)&functor.new_parent_code.shared_alloc_.direct_ptr);
    Write<int>::Write((Write<int> *)&functor.old_parents.codes.write_.shared_alloc_.direct_ptr,
                      (Write<int> *)local_78);
    Few<Omega_h::Read<int>,_4>::Few
              ((Few<Omega_h::Read<int>,_4> *)&functor.new_parent_idx.shared_alloc_.direct_ptr,
               old_ents2new_ents);
    Write<signed_char>::Write
              ((Write<signed_char> *)
               &functor.old_ents2new_ents.array_[3].write_.shared_alloc_.direct_ptr,
               (Write<signed_char> *)local_c0);
    parallel_for<Omega_h::unmap_parents(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>*,Omega_h::Few<Omega_h::Read<int>,4>)::__0>
              (new_parent_idx.shared_alloc_.direct_ptr._4_4_,(type *)local_198);
    IVar2 = new_ents2old_ents.write_.shared_alloc_.direct_ptr._4_4_;
    Write<int>::Write(&local_1d8,(Write<int> *)local_78);
    Read<int>::Read(&local_1c8,&local_1d8);
    Write<signed_char>::Write(&local_1f8,(Write<signed_char> *)local_c0);
    Read<signed_char>::Read(&local_1e8,&local_1f8);
    Parents::Parents(&local_1b8,&local_1c8,&local_1e8);
    Mesh::set_parents(new_mesh,IVar2,&local_1b8);
    Parents::~Parents(&local_1b8);
    Read<signed_char>::~Read(&local_1e8);
    Write<signed_char>::~Write(&local_1f8);
    Read<int>::~Read(&local_1c8);
    Write<int>::~Write(&local_1d8);
    unmap_parents(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>*,Omega_h::Few<Omega_h::Read<int>,4>)
    ::$_0::~__0((__0 *)local_198);
    Parents::~Parents((Parents *)&functor.new_parent_code.shared_alloc_.direct_ptr);
    Write<signed_char>::~Write((Write<signed_char> *)local_c0);
    Write<int>::~Write((Write<int> *)local_78);
    Read<int>::~Read((Read<int> *)auStack_60);
    new_ents2old_ents.write_.shared_alloc_.direct_ptr._4_4_ =
         new_ents2old_ents.write_.shared_alloc_.direct_ptr._4_4_ + 1;
  }
  return;
}

Assistant:

void unmap_parents(Mesh* old_mesh, Mesh* new_mesh,
    LOs new_ents2old_ents_a[], Few<LOs, 4> old_ents2new_ents) {
  for (Int ent_dim = 1; ent_dim <= new_mesh->dim(); ++ent_dim) {
    auto new_ents2old_ents = new_ents2old_ents_a[ent_dim];
    auto nnew_ents = new_ents2old_ents.size();
    Write<LO> new_parent_idx(nnew_ents, -1, "parent idx");
    Write<Byte> new_parent_code(nnew_ents, 0, "parent code");
    auto old_parents = old_mesh->ask_parents(ent_dim);
    auto functor = OMEGA_H_LAMBDA(LO new_ent) {
      auto old_ent = new_ents2old_ents[new_ent];
      auto old_parent_idx = old_parents.parent_idx[old_ent];
      auto old_parent_code = old_parents.codes[old_ent];
      if (old_parent_idx > -1) {
        auto old_parent_dim = amr::code_parent_dim(old_parent_code);
        new_parent_idx[new_ent] =
          old_ents2new_ents[old_parent_dim][old_parent_idx];
        if (new_parent_idx[new_ent] > -1)
          new_parent_code[new_ent] = old_parent_code;
      }
    };
    parallel_for(nnew_ents, std::move(functor));
    new_mesh->set_parents(ent_dim, Parents{new_parent_idx, new_parent_code});
  }
}